

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.h
# Opt level: O2

void __thiscall cfd::core::ScriptOperator::~ScriptOperator(ScriptOperator *this)

{
  this->_vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_00700730;
  ::std::__cxx11::string::~string((string *)&this->text_data_);
  return;
}

Assistant:

virtual ~ScriptOperator() {
    // do nothing
  }